

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

uint32_t bits_ask(aec_stream_conflict *strm,int n)

{
  byte *pbVar1;
  int n_local;
  aec_stream_conflict *strm_local;
  
  while( true ) {
    if (n <= strm->state->bitp) {
      return 1;
    }
    if (strm->avail_in == 0) break;
    strm->avail_in = strm->avail_in - 1;
    strm->state->acc = strm->state->acc << 8;
    pbVar1 = strm->next_in;
    strm->next_in = pbVar1 + 1;
    strm->state->acc = (ulong)*pbVar1 | strm->state->acc;
    strm->state->bitp = strm->state->bitp + 8;
  }
  return 0;
}

Assistant:

static inline uint32_t bits_ask(struct aec_stream *strm, int n)
{
    while (strm->state->bitp < n) {
        if (strm->avail_in == 0)
            return 0;
        strm->avail_in--;
        strm->state->acc <<= 8;
        strm->state->acc |= *strm->next_in++;
        strm->state->bitp += 8;
    }
    return 1;
}